

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enable_shared_from_this4.cpp
# Opt level: O2

void __thiscall A::~A(A *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"A::~A()");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<A>)._M_weak_this.
              super___weak_ptr<A,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

~A() {
		cout << "A::~A()" << endl;
	}